

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOLinker.cxx
# Opt level: O0

void __thiscall
cmBinUtilsMacOSMachOLinker::cmBinUtilsMacOSMachOLinker
          (cmBinUtilsMacOSMachOLinker *this,cmRuntimeDependencyArchive *archive)

{
  cmRuntimeDependencyArchive *archive_local;
  cmBinUtilsMacOSMachOLinker *this_local;
  
  cmBinUtilsLinker::cmBinUtilsLinker(&this->super_cmBinUtilsLinker,archive);
  (this->super_cmBinUtilsLinker)._vptr_cmBinUtilsLinker =
       (_func_int **)&PTR__cmBinUtilsMacOSMachOLinker_016839f8;
  std::
  unique_ptr<cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,std::default_delete<cmBinUtilsMacOSMachOGetRuntimeDependenciesTool>>
  ::unique_ptr<std::default_delete<cmBinUtilsMacOSMachOGetRuntimeDependenciesTool>,void>
            ((unique_ptr<cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,std::default_delete<cmBinUtilsMacOSMachOGetRuntimeDependenciesTool>>
              *)&this->Tool);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmBinUtilsMacOSMachOLinker::FileInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmBinUtilsMacOSMachOLinker::FileInfo>_>_>
  ::unordered_map(&this->ScannedFileInfo);
  return;
}

Assistant:

cmBinUtilsMacOSMachOLinker::cmBinUtilsMacOSMachOLinker(
  cmRuntimeDependencyArchive* archive)
  : cmBinUtilsLinker(archive)
{
}